

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp.h
# Opt level: O1

void __thiscall libDAI::BP::updateMessage(BP *this,size_t iI)

{
  Real a;
  pointer pTVar1;
  pointer pTVar2;
  TProb<double> *this_00;
  TProb<double> local_60;
  TProb<double> local_48;
  TProb<double> local_30;
  
  a = (this->Props).damping;
  if ((a != 0.0) || (NAN(a))) {
    TProb<double>::operator^
              (&local_48,
               (this->_messages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + iI,a);
    TProb<double>::operator^
              (&local_60,
               (this->_newmessages).
               super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start + iI,1.0 - (this->Props).damping);
    TProb<double>::operator*(&local_30,&local_48,&local_60);
    this_00 = (this->_messages).
              super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
              _M_impl.super__Vector_impl_data._M_start + iI;
    if (this_00 != &local_30) {
      std::vector<double,_std::allocator<double>_>::operator=(&this_00->_p,&local_30._p);
    }
    if (local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_30._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_48._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    pTVar1 = (this->_messages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pTVar2 = (this->_newmessages).
             super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pTVar1 != pTVar2) {
      std::vector<double,_std::allocator<double>_>::operator=(&pTVar1[iI]._p,&pTVar2[iI]._p);
      return;
    }
  }
  return;
}

Assistant:

void updateMessage(size_t iI) {
                if( Props.damping == 0.0 )
                    _messages[iI] = _newmessages[iI];
                else
                    _messages[iI] = (_messages[iI] ^ Props.damping) * (_newmessages[iI] ^ (1.0 - Props.damping));
            }